

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::StreamingListener
          (StreamingListener *this,string *host,string *port)

{
  SocketWriter *this_00;
  
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__StreamingListener_00145c58;
  this_00 = (SocketWriter *)operator_new(0x50);
  SocketWriter::SocketWriter(this_00,host,port);
  (this->socket_writer_).ptr_ = (AbstractSocketWriter *)this_00;
  Start(this);
  return;
}

Assistant:

StreamingListener(const string& host, const string& port)
      : socket_writer_(new SocketWriter(host, port)) { Start(); }